

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch_row_verifier.cpp
# Opt level: O0

unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
duckdb::FetchRowVerifier::Create
          (SQLStatement *statement_p,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  *in_RDX;
  long *in_RSI;
  __uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_> in_RDI
  ;
  unique_ptr<duckdb::FetchRowVerifier,_std::default_delete<duckdb::FetchRowVerifier>_>
  *in_stack_ffffffffffffffa8;
  __uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_> this;
  __uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_> args;
  
  this._M_t.
  super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
  .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl =
       in_RDI._M_t.
       super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
       .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl;
  args._M_t.
  super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
  .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl =
       in_RDI._M_t.
       super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
       .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl;
  (**(code **)(*in_RSI + 0x18))();
  make_uniq<duckdb::FetchRowVerifier,duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,duckdb::optional_ptr<std::unordered_map<std::__cxx11::string,duckdb::BoundParameterData,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>>,true>&>
            ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             args._M_t.
             super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
             .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl,in_RDX);
  unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>::
  unique_ptr<duckdb::FetchRowVerifier,std::default_delete<std::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>>>,void>
            ((unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              *)this._M_t.
                super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
                .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl,
             in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::FetchRowVerifier,_std::default_delete<duckdb::FetchRowVerifier>,_true>::
  ~unique_ptr((unique_ptr<duckdb::FetchRowVerifier,_std::default_delete<duckdb::FetchRowVerifier>,_true>
               *)0x197bb67);
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             0x197bb71);
  return (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (_Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
          )in_RDI._M_t.
           super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
           .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<StatementVerifier>
FetchRowVerifier::Create(const SQLStatement &statement_p,
                         optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {
	return make_uniq<FetchRowVerifier>(statement_p.Copy(), parameters);
}